

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O2

void av1_noop_first_pass_frame(AV1_COMP *cpi,int64_t ts_duration)

{
  int iVar1;
  int iVar2;
  FRAME_STATS stats;
  
  iVar1 = (cpi->oxcf).frm_dim_cfg.forced_max_frame_width;
  iVar2 = (cpi->oxcf).frm_dim_cfg.forced_max_frame_height;
  if (iVar1 == 0) {
    iVar1 = (cpi->common).mi_params.mb_cols;
  }
  else {
    iVar1 = (iVar1 + 7 >> 2) + 2 >> 2;
  }
  if (iVar2 == 0) {
    iVar2 = (cpi->common).mi_params.mb_rows;
  }
  else {
    iVar2 = (iVar2 + 7 >> 2) + 2 >> 2;
  }
  setup_firstpass_data(&cpi->common,&cpi->firstpass_data,iVar2,iVar1);
  accumulate_frame_stats(&stats,(cpi->firstpass_data).mb_stats,iVar2,iVar1);
  av1_free_firstpass_data(&cpi->firstpass_data);
  update_firstpass_stats
            (cpi,&stats,1.0,(cpi->common).current_frame.frame_number,ts_duration,BLOCK_16X16);
  return;
}

Assistant:

void av1_noop_first_pass_frame(AV1_COMP *cpi, const int64_t ts_duration) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  int max_mb_rows = mi_params->mb_rows;
  int max_mb_cols = mi_params->mb_cols;
  if (cpi->oxcf.frm_dim_cfg.forced_max_frame_width) {
    int max_mi_cols = size_in_mi(cpi->oxcf.frm_dim_cfg.forced_max_frame_width);
    max_mb_cols = ROUND_POWER_OF_TWO(max_mi_cols, 2);
  }
  if (cpi->oxcf.frm_dim_cfg.forced_max_frame_height) {
    int max_mi_rows = size_in_mi(cpi->oxcf.frm_dim_cfg.forced_max_frame_height);
    max_mb_rows = ROUND_POWER_OF_TWO(max_mi_rows, 2);
  }
  const int unit_rows = get_unit_rows(BLOCK_16X16, max_mb_rows);
  const int unit_cols = get_unit_cols(BLOCK_16X16, max_mb_cols);
  setup_firstpass_data(cm, &cpi->firstpass_data, unit_rows, unit_cols);
  FRAME_STATS *mb_stats = cpi->firstpass_data.mb_stats;
  FRAME_STATS stats = accumulate_frame_stats(mb_stats, unit_rows, unit_cols);
  av1_free_firstpass_data(&cpi->firstpass_data);
  update_firstpass_stats(cpi, &stats, 1.0, current_frame->frame_number,
                         ts_duration, BLOCK_16X16);
}